

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseClassConstructor
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *constructAttributes)

{
  unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *__args;
  const_iterator __position;
  Token *pTVar1;
  _func_int ***ppp_Var2;
  undefined8 uVar3;
  bool bVar4;
  Lexer *pLVar5;
  Parser *this_00;
  initializer_list<pfederc::Position> __l;
  undefined1 local_b0 [16];
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_a0;
  Parser *local_98;
  undefined1 local_8c [28];
  Token *local_70;
  Position local_68;
  undefined1 local_48 [16];
  
  local_70 = this->lexer->currentToken;
  Lexer::next(this->lexer);
  local_98 = this;
  parseExpression((Parser *)local_b0,(Precedence)this);
  __args = (unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)(local_8c + 4);
  pLVar5 = (Lexer *)local_b0._0_8_;
  while( true ) {
    local_b0._0_8_ = pLVar5;
    bVar4 = isBiOpExpr((Expr *)local_b0._0_8_,TOK_OP_COMMA);
    uVar3 = local_b0._0_8_;
    if (!bVar4) {
      bVar4 = isBiOpExpr((Expr *)local_b0._0_8_,TOK_OP_DCL);
      pLVar5 = (Lexer *)local_b0._0_8_;
      if (bVar4) {
        local_b0._0_8_ = (Lexer *)0x0;
        if ((pLVar5 == (Lexer *)0x0) ||
           (*&pLVar5->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_00128998)) {
          pLVar5 = (Lexer *)0x0;
        }
        local_8c._4_8_ = pLVar5;
        std::__cxx11::
        list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>
        ::emplace<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>
                  ((list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>
                    *)constructAttributes,
                   (constructAttributes->
                   super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next,
                   (unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                   (local_8c + 4));
        this_00 = local_98;
        std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                   (local_8c + 4));
      }
      else {
        local_a0._M_t.
        super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl._0_2_
             = 2;
        local_68.line = CONCAT44(local_68.line._4_4_,9);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_8c + 4),(SyntaxErrorCode *)&local_a0,&local_68);
        this_00 = local_98;
        generateError((Parser *)(local_48 + 8),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)local_98);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_48 + 8));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_8c + 4));
      }
      bVar4 = expect(this_00,TOK_BRACKET_CLOSE);
      if (!bVar4) {
        local_b0._12_2_ = 2;
        local_8c._0_4_ = 1;
        pTVar1 = this_00->lexer->currentToken;
        local_68.line = (local_70->pos).line;
        local_68.startIndex = (local_70->pos).startIndex;
        local_68.endIndex = (local_70->pos).endIndex;
        __l._M_len = 1;
        __l._M_array = &local_68;
        std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                  ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(local_8c + 4),
                   __l,(allocator_type *)(local_b0 + 0xf));
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                  ((Level *)&local_a0,(SyntaxErrorCode *)(local_b0 + 0xc),(Position *)local_8c,
                   (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pTVar1->pos);
        generateError((Parser *)local_48,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this_00);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_48);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(&local_a0);
        std::_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>::~_Vector_base
                  ((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
                   (local_8c + 4));
      }
      if ((Lexer *)local_b0._0_8_ != (Lexer *)0x0) {
        (*(*(_func_int ***)local_b0._0_8_)[1])();
      }
      return;
    }
    if (*(_func_int ***)local_b0._0_8_ != (_func_int **)&PTR__BiOpExpr_00128998) break;
    bVar4 = isBiOpExpr(*(Expr **)((long)&((string *)(local_b0._0_8_ + 0x38))->field_2 + 8),
                       TOK_OP_DCL);
    if (bVar4) {
      __position._M_node =
           (constructAttributes->
           super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
      local_8c._4_8_ = *(undefined8 *)((long)&((string *)(uVar3 + 0x38))->field_2 + 8);
      *(undefined8 *)((long)&((string *)(uVar3 + 0x38))->field_2 + 8) = 0;
      if (((Lexer *)local_8c._4_8_ == (Lexer *)0x0) ||
         (((Lexer *)local_8c._4_8_)->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_00128998)) {
        local_8c._4_8_ = (Lexer *)0x0;
      }
      std::__cxx11::
      list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>
      ::emplace<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>
                ((list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>
                  *)constructAttributes,__position,__args);
      std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                (__args);
    }
    else {
      local_a0._M_t.
      super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl._0_2_ =
           2;
      local_68.line = CONCAT44(local_68.line._4_4_,9);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)__args,(SyntaxErrorCode *)&local_a0,&local_68);
      generateError((Parser *)&stack0xffffffffffffffc8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)local_98);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffc8);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)__args);
    }
    pLVar5 = *(Lexer **)&((string *)(uVar3 + 0x38))->field_2;
    (((string *)(uVar3 + 0x38))->field_2)._M_allocated_capacity = 0;
    if ((Lexer *)local_b0._0_8_ != (Lexer *)0x0) {
      ppp_Var2 = (_func_int ***)local_b0._0_8_;
      local_b0._0_8_ = pLVar5;
      (*(*ppp_Var2)[1])();
      pLVar5 = (Lexer *)local_b0._0_8_;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void Parser::parseClassConstructor(bool &err,
    std::list<std::unique_ptr<BiOpExpr>> &constructAttributes) noexcept {
  const Token *const constructStart = lexer.getCurrentToken();
  lexer.next();

  std::unique_ptr<Expr> expr(parseExpression());
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    if (!isBiOpExpr(biopexpr.getRight(), TokenType::TOK_OP_DCL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, biopexpr.getRight().getPosition()));
      // advance to next left expression
      expr = biopexpr.getLeftPtr();
      continue;
    }

    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(biopexpr.getRightPtr().release())));
    // advance to next left expression
    expr = biopexpr.getLeftPtr();
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, expr->getPosition()));
    // soft error
  } else {
    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(expr.release())));
  }

  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition(),
      std::vector<Position>{ constructStart->getPosition() }));
  }
}